

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_encodeSequences_bmi2
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong *puVar6;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  ulong uVar16;
  BIT_CStream_t blockStream;
  FSE_CState_t stateLitLength;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  ulong uVar7;
  
  puVar6 = (ulong *)((long)dst + (dstCapacity - 8));
  if (dstCapacity < 9) {
    sVar9 = 0xffffffffffffffba;
  }
  else {
    blockStream.startPtr = (char *)dst;
    blockStream.endPtr = (char *)puVar6;
    FSE_initCState2(&stateMatchLength,CTable_MatchLength,(uint)mlCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateOffsetBits,CTable_OffsetBits,(uint)ofCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateLitLength,CTable_LitLength,(uint)llCodeTable[nbSeq - 1]);
    uVar4 = LL_bits[llCodeTable[nbSeq - 1]];
    uVar10 = (ulong)((uint)sequences[nbSeq - 1].matchLength &
                    BIT_mask[ML_bits[mlCodeTable[nbSeq - 1]]]) << ((ulong)uVar4 & 0x3f) |
             (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar4]);
    uVar4 = ML_bits[mlCodeTable[nbSeq - 1]] + uVar4;
    uVar16 = (ulong)uVar4;
    if (longOffsets == 0) {
      uVar10 = (ulong)(BIT_mask[ofCodeTable[nbSeq - 1]] & sequences[nbSeq - 1].offset) <<
               (uVar16 & 0x3f) | uVar10;
      uVar4 = uVar4 + ofCodeTable[nbSeq - 1];
    }
    else {
      bVar1 = ofCodeTable[nbSeq - 1];
      uVar11 = (ulong)bVar1;
      puVar15 = (ulong *)dst;
      if (bVar1 < 0x38) {
        uVar13 = sequences[nbSeq - 1].offset;
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        uVar13 = sequences[nbSeq - 1].offset;
        if (bVar1 != 0x38) {
          uVar5 = bVar1 - 0x38;
          uVar10 = (ulong)(BIT_mask[uVar5] & uVar13) << (uVar16 & 0x3f) | uVar10;
          uVar4 = (bVar1 + uVar4) - 0x38;
          puVar15 = (ulong *)((ulong)(uVar4 >> 3) + (long)dst);
          if (puVar6 < puVar15) {
            puVar15 = puVar6;
          }
          *(ulong *)dst = uVar10;
          uVar16 = (ulong)(uVar4 & 7);
          uVar10 = uVar10 >> ((ulong)((byte)uVar4 & 0xf8) & 0x3f);
        }
        uVar11 = 0x38;
      }
      uVar10 = (ulong)(uVar13 >> (uVar5 & 0x1f) & BIT_mask[uVar11]) << (uVar16 & 0x3f) | uVar10;
      uVar4 = (int)uVar16 + (int)uVar11;
      dst = puVar15;
    }
    *(ulong *)dst = uVar10;
    blockStream.ptr = (char *)((ulong)(uVar4 >> 3) + (long)dst);
    if (puVar6 < blockStream.ptr) {
      blockStream.ptr = (char *)puVar6;
    }
    blockStream.bitContainer = uVar10 >> ((ulong)((byte)uVar4 & 0xf8) & 0x3f);
    for (uVar16 = nbSeq - 2; blockStream.bitPos = uVar4 & 7, uVar16 < nbSeq; uVar16 = uVar16 - 1) {
      bVar1 = llCodeTable[uVar16];
      bVar2 = ofCodeTable[uVar16];
      uVar10 = (ulong)bVar2;
      uVar4 = (uint)bVar2;
      bVar3 = mlCodeTable[uVar16];
      uVar13 = LL_bits[bVar1];
      uVar5 = ML_bits[bVar3];
      FSE_encodeSymbol(&blockStream,&stateOffsetBits,(uint)bVar2);
      FSE_encodeSymbol(&blockStream,&stateMatchLength,(uint)bVar3);
      FSE_encodeSymbol(&blockStream,&stateLitLength,(uint)bVar1);
      uVar12 = uVar5 + uVar13 + bVar2;
      uVar14 = blockStream.bitPos;
      if (0x1e < uVar12) {
        *(size_t *)blockStream.ptr = blockStream.bitContainer;
        blockStream.ptr = blockStream.ptr + (blockStream.bitPos >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar14 = blockStream.bitPos & 7;
        blockStream.bitContainer =
             blockStream.bitContainer >> ((ulong)((byte)blockStream.bitPos & 0xf8) & 0x3f);
      }
      uVar11 = (ulong)((uint)sequences[uVar16].matchLength & BIT_mask[uVar5]) <<
               ((ulong)(uVar14 + uVar13) & 0x3f) |
               (ulong)((uint)sequences[uVar16].litLength & BIT_mask[uVar13]) <<
               ((ulong)uVar14 & 0x3f) | blockStream.bitContainer;
      uVar5 = uVar14 + uVar13 + uVar5;
      uVar13 = uVar5;
      if (0x38 < uVar12) {
        *(ulong *)blockStream.ptr = uVar11;
        blockStream.ptr = blockStream.ptr + (uVar5 >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar13 = uVar5 & 7;
        uVar11 = uVar11 >> ((ulong)((byte)uVar5 & 0xf8) & 0x3f);
      }
      uVar7 = (ulong)uVar13;
      if (longOffsets == 0) {
        uVar13 = BIT_mask[bVar2] & sequences[uVar16].offset;
      }
      else {
        if (bVar2 < 0x38) {
          uVar5 = sequences[uVar16].offset;
          uVar14 = 0;
        }
        else {
          uVar14 = 0;
          uVar5 = sequences[uVar16].offset;
          if (bVar2 != 0x38) {
            uVar14 = bVar2 - 0x38;
            uVar11 = (ulong)(BIT_mask[uVar14] & uVar5) << (uVar7 & 0x3f) | uVar11;
            uVar4 = (uVar13 + bVar2) - 0x38;
            *(ulong *)blockStream.ptr = uVar11;
            blockStream.ptr = blockStream.ptr + (uVar4 >> 3);
            if (blockStream.endPtr < blockStream.ptr) {
              blockStream.ptr = blockStream.endPtr;
            }
            uVar7 = (ulong)(uVar4 & 7);
            uVar11 = uVar11 >> ((ulong)((byte)uVar4 & 0xf8) & 0x3f);
          }
          uVar10 = 0x38;
        }
        uVar4 = (uint)uVar10;
        uVar13 = uVar5 >> (uVar14 & 0x1f) & BIT_mask[uVar10];
      }
      uVar11 = (ulong)uVar13 << (uVar7 & 0x3f) | uVar11;
      uVar4 = (int)uVar7 + uVar4;
      *(ulong *)blockStream.ptr = uVar11;
      blockStream.ptr = blockStream.ptr + (uVar4 >> 3);
      if (blockStream.endPtr < blockStream.ptr) {
        blockStream.ptr = blockStream.endPtr;
      }
      blockStream.bitContainer = uVar11 >> ((ulong)((byte)uVar4 & 0xf8) & 0x3f);
    }
    FSE_flushCState(&blockStream,&stateMatchLength);
    FSE_flushCState(&blockStream,&stateOffsetBits);
    FSE_flushCState(&blockStream,&stateLitLength);
    sVar8 = BIT_closeCStream(&blockStream);
    sVar9 = 0xffffffffffffffba;
    if (sVar8 != 0) {
      sVar9 = sVar8;
    }
  }
  return sVar9;
}

Assistant:

size_t
ZSTD_encodeSequences_bmi2(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets)
{
    return ZSTD_encodeSequences_body(dst, dstCapacity,
                                    CTable_MatchLength, mlCodeTable,
                                    CTable_OffsetBits, ofCodeTable,
                                    CTable_LitLength, llCodeTable,
                                    sequences, nbSeq, longOffsets);
}